

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

void __thiscall
icu_63::UnicodeString::UnicodeString(UnicodeString *this,int32_t capacity,UChar32 c,int32_t count)

{
  uint len;
  UBool UVar1;
  char16_t *pcVar2;
  ulong uVar3;
  
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_00471e80
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 0;
  if ((uint)c < 0x110000 && 0 < count) {
    if ((uint)c < 0x10000) {
      if (capacity <= count) {
        capacity = count;
      }
      UVar1 = allocate(this,capacity);
      if (UVar1 == '\0') {
        return;
      }
      if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        pcVar2 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar2 = (char16_t *)((long)&this->fUnion + 2);
      }
      for (uVar3 = 0; (uint)count != uVar3; uVar3 = uVar3 + 1) {
        pcVar2[uVar3] = (char16_t)c;
      }
      setLength(this,count);
      return;
    }
    if ((uint)count < 0x40000000) {
      len = count * 2;
      if (capacity < (int)len) {
        capacity = len;
      }
      UVar1 = allocate(this,capacity);
      if (UVar1 == '\0') {
        return;
      }
      if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        pcVar2 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar2 = (char16_t *)((long)&this->fUnion + 2);
      }
      for (uVar3 = 0; uVar3 < len; uVar3 = uVar3 + 2) {
        pcVar2[uVar3] = (short)((uint)c >> 10) + L'ퟀ';
        pcVar2[uVar3 + 1] = (char16_t)c & 0x3ffU | 0xdc00;
      }
      setLength(this,len);
      return;
    }
  }
  allocate(this,capacity);
  return;
}

Assistant:

UnicodeString::UnicodeString(int32_t capacity, UChar32 c, int32_t count) {
  fUnion.fFields.fLengthAndFlags = 0;
  if(count <= 0 || (uint32_t)c > 0x10ffff) {
    // just allocate and do not do anything else
    allocate(capacity);
  } else if(c <= 0xffff) {
    int32_t length = count;
    if(capacity < length) {
      capacity = length;
    }
    if(allocate(capacity)) {
      UChar *array = getArrayStart();
      UChar unit = (UChar)c;
      for(int32_t i = 0; i < length; ++i) {
        array[i] = unit;
      }
      setLength(length);
    }
  } else {  // supplementary code point, write surrogate pairs
    if(count > (INT32_MAX / 2)) {
      // We would get more than 2G UChars.
      allocate(capacity);
      return;
    }
    int32_t length = count * 2;
    if(capacity < length) {
      capacity = length;
    }
    if(allocate(capacity)) {
      UChar *array = getArrayStart();
      UChar lead = U16_LEAD(c);
      UChar trail = U16_TRAIL(c);
      for(int32_t i = 0; i < length; i += 2) {
        array[i] = lead;
        array[i + 1] = trail;
      }
      setLength(length);
    }
  }
}